

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O2

void __thiscall duckdb::roaring::RoaringAnalyzeState::FlushContainer(RoaringAnalyzeState *this)

{
  ContainerMetadata metadata_00;
  idx_t iVar1;
  idx_t iVar2;
  RoaringAnalyzeState *this_00;
  bool bVar3;
  ContainerMetadata metadata;
  ContainerMetadata local_24;
  
  if (this->count != 0) {
    this_00 = this;
    metadata_00 = GetResult(this);
    bVar3 = metadata_00.container_type == RUN_CONTAINER;
    iVar1 = (ulong)!bVar3 + (this->metadata_collection).arrays_in_segment;
    iVar2 = (ulong)bVar3 + (this->metadata_collection).runs_in_segment;
    iVar1 = ContainerMetadataCollection::GetMetadataSize
                      ((ContainerMetadataCollection *)this_00,iVar2 + iVar1,iVar2,iVar1);
    this->metadata_size = iVar1;
    iVar2 = ContainerMetadata::GetDataSizeInBytes(&local_24,(ulong)this->count);
    iVar2 = iVar2 + this->data_size;
    this->data_size = iVar2;
    bVar3 = HasEnoughSpaceInSegment(this,iVar1 + iVar2);
    if (!bVar3) {
      FlushSegment(this);
    }
    ::std::
    vector<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
    ::push_back(&(this->container_metadata).
                 super_vector<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
                ,&local_24);
    ContainerMetadataCollection::AddMetadata(&this->metadata_collection,metadata_00);
    this->current_count = this->current_count + (ulong)this->count;
    this->count = 0;
    this->one_count = 0;
    this->zero_count = 0;
    *(undefined4 *)((long)&this->zero_count + 1) = 0;
  }
  return;
}

Assistant:

void RoaringAnalyzeState::FlushContainer() {
	if (!count) {
		return;
	}
	auto metadata = GetResult();
	idx_t runs_count = metadata_collection.GetRunContainerCount();
	idx_t arrays_count = metadata_collection.GetArrayAndBitsetContainerCount();

	if (metadata.IsRun()) {
		runs_count++;
	} else {
		arrays_count++;
	}

	metadata_size = metadata_collection.GetMetadataSize(runs_count + arrays_count, runs_count, arrays_count);

	data_size += metadata.GetDataSizeInBytes(count);
	if (!HasEnoughSpaceInSegment(metadata_size + data_size)) {
		FlushSegment();
	}
	container_metadata.push_back(metadata);
	metadata_collection.AddMetadata(metadata);
	current_count += count;

	// Reset the container analyze state
	one_count = 0;
	zero_count = 0;
	run_count = 0;
	last_bit_set = false;
	count = 0;
}